

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.h
# Opt level: O2

RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> * __thiscall
data_structures::RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::operator=
          (RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *this,
          RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *tree)

{
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *this_00;
  
  if (tree->_root ==
      (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
       *)0x0) {
    this->_root = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                   *)0x0;
  }
  else {
    this_00 = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
               *)operator_new(0x70);
    RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
    ::RBTreeNode(this_00);
    this->_root = this_00;
    _copy(this,(EVP_PKEY_CTX *)this_00,(EVP_PKEY_CTX *)tree->_root);
  }
  return this;
}

Assistant:

inline
    RBTree<Key, Value>& RBTree<Key, Value>::operator=(const RBTree<Key, Value>& tree) {
        if (tree._root == nullptr) {
            _root = nullptr;
            return *this;
        }
        _root = new RBTreeNode<TreeElement<Key, Value>>();
        _copy(_root, tree._root);
        return *this;
    }